

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::CallCFuncException::CallCFuncException<char_const(&)[8],int&,char_const(&)[11]>
          (CallCFuncException *this,char (*args) [8],int *args_1,char (*args_2) [11])

{
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  Exception::SetWhat<char_const(&)[8],int&,char_const(&)[11]>
            (&this->super_Exception,args,args_1,args_2);
  return;
}

Assistant:

CallCFuncException(Args&&... args)
        {
            SetWhat(std::forward<Args>(args)...);
        }